

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::ViewportState::ViewportState
          (ViewportState *this,ViewportState *other)

{
  uint uVar1;
  VkViewport *__first;
  VkRect2D *__first_00;
  reference pvVar2;
  reference pvVar3;
  allocator<vk::VkRect2D> local_61;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_60;
  allocator<vk::VkViewport> local_31;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_30;
  ViewportState *local_18;
  ViewportState *other_local;
  ViewportState *this_local;
  
  local_18 = other;
  other_local = this;
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector(&this->m_viewports);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector(&this->m_scissors);
  (this->super_VkPipelineViewportStateCreateInfo).sType =
       (local_18->super_VkPipelineViewportStateCreateInfo).sType;
  (this->super_VkPipelineViewportStateCreateInfo).pNext =
       (local_18->super_VkPipelineViewportStateCreateInfo).pNext;
  (this->super_VkPipelineViewportStateCreateInfo).flags =
       (local_18->super_VkPipelineViewportStateCreateInfo).flags;
  (this->super_VkPipelineViewportStateCreateInfo).viewportCount =
       (local_18->super_VkPipelineViewportStateCreateInfo).viewportCount;
  (this->super_VkPipelineViewportStateCreateInfo).scissorCount =
       (local_18->super_VkPipelineViewportStateCreateInfo).scissorCount;
  __first = (local_18->super_VkPipelineViewportStateCreateInfo).pViewports;
  uVar1 = (this->super_VkPipelineViewportStateCreateInfo).viewportCount;
  std::allocator<vk::VkViewport>::allocator(&local_31);
  std::vector<vk::VkViewport,std::allocator<vk::VkViewport>>::vector<vk::VkViewport_const*,void>
            ((vector<vk::VkViewport,std::allocator<vk::VkViewport>> *)&local_30,__first,
             __first + uVar1,&local_31);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::operator=
            (&this->m_viewports,&local_30);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_30);
  std::allocator<vk::VkViewport>::~allocator(&local_31);
  __first_00 = (local_18->super_VkPipelineViewportStateCreateInfo).pScissors;
  uVar1 = (this->super_VkPipelineViewportStateCreateInfo).scissorCount;
  std::allocator<vk::VkRect2D>::allocator(&local_61);
  std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::vector<vk::VkRect2D_const*,void>
            ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)&local_60,__first_00,
             __first_00 + uVar1,&local_61);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::operator=(&this->m_scissors,&local_60);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_60);
  std::allocator<vk::VkRect2D>::~allocator(&local_61);
  pvVar2 = std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::operator[]
                     (&this->m_viewports,0);
  (this->super_VkPipelineViewportStateCreateInfo).pViewports = pvVar2;
  pvVar3 = std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::operator[](&this->m_scissors,0)
  ;
  (this->super_VkPipelineViewportStateCreateInfo).pScissors = pvVar3;
  return;
}

Assistant:

PipelineCreateInfo::ViewportState::ViewportState (const ViewportState& other)
{
	sType			= other.sType;
	pNext			= other.pNext;
	flags			= other.flags;
	viewportCount	= other.viewportCount;
	scissorCount	= other.scissorCount;

	m_viewports = std::vector<vk::VkViewport>(other.pViewports, other.pViewports + viewportCount);
	m_scissors	= std::vector<vk::VkRect2D>(other.pScissors, other.pScissors + scissorCount);

	pViewports	= &m_viewports[0];
	pScissors	= &m_scissors[0];
}